

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O3

DdNode * cuddRemapUnderApprox(DdManager *dd,DdNode *f,int numVars,int threshold,double quality)

{
  undefined1 (*pauVar1) [12];
  double dVar2;
  DdNode *g;
  FILE *__stream;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ApproxInfo *info;
  DdLevelQueue *queue;
  DdLevelQueue *queue_00;
  void *pvVar14;
  ulong uVar15;
  DdNode *pDVar16;
  uint uVar17;
  DdNode *pDVar18;
  byte bVar19;
  uint *puVar20;
  DdNode *key;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  NodeData *infoE;
  NodeData *infoT;
  NodeData *infoN;
  DdNode *local_c8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  double *local_98;
  double *local_90;
  double *local_88;
  DdNode *local_80;
  DdNode *local_78;
  int local_6c;
  undefined1 local_68 [16];
  double local_58;
  char *local_50;
  undefined1 local_48 [16];
  
  if (f == (DdNode *)0x0) {
    fwrite("Cannot subset, nil object\n",0x1a,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
  }
  else {
    puVar20 = (uint *)((ulong)f & 0xfffffffffffffffe);
    if (*puVar20 == 0x7fffffff) {
      return f;
    }
    local_58 = quality;
    info = gatherInfo(dd,f,numVars,1);
    if (info == (ApproxInfo *)0x0) {
      fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
    }
    else {
      queue = cuddLevelQueueInit(dd->size,0x28,info->size);
      if (queue != (DdLevelQueue *)0x0) {
        queue_00 = cuddLevelQueueInit(dd->size,0x20,dd->initSlots);
        if (queue_00 != (DdLevelQueue *)0x0) {
          iVar11 = 0x7fffffff;
          if ((ulong)*puVar20 != 0x7fffffff) {
            iVar11 = dd->perm[*puVar20];
          }
          pvVar14 = cuddLevelQueueEnqueue(queue,puVar20,iVar11);
          if (pvVar14 != (void *)0x0) {
            uVar17 = (uint)(((ulong)f & 1) == 0);
            auVar8._4_8_ = 0;
            auVar8._0_4_ = (uint)((long)((ulong)uVar17 << 0x3f) >> 0x3f);
            auVar22._0_12_ = auVar8 << 0x20;
            auVar22._12_4_ = (int)((long)((ulong)uVar17 << 0x3f) >> 0x3f);
            auVar29._12_4_ = 0x3ff00000;
            auVar29._0_12_ = ZEXT812(0);
            *(undefined1 (*) [16])((long)pvVar14 + 0x18) =
                 ~auVar22 & auVar29 | ZEXT816(0x3ff0000000000000) & auVar22;
            pvVar14 = queue->first;
            iVar12 = threshold;
            iVar11 = local_6c;
            do {
              local_6c = iVar12;
              if ((pvVar14 == (void *)0x0) || (iVar11 = local_6c, info->size <= local_6c)) {
                local_6c = iVar11;
                cuddLevelQueueQuit(queue);
                cuddLevelQueueQuit(queue_00);
                pDVar16 = RAbuildSubset(dd,f,info);
                if ((pDVar16 != (DdNode *)0x0) &&
                   (iVar11 = info->size, iVar12 = Cudd_DagSize(pDVar16), iVar11 < iVar12)) {
                  __stream = (FILE *)dd->err;
                  uVar17 = info->size;
                  uVar13 = Cudd_DagSize(pDVar16);
                  fprintf(__stream,"Wrong prediction: %d versus actual %d\n",(ulong)uVar17,
                          (ulong)uVar13);
                }
                if (info->page != (NodeData *)0x0) {
                  free(info->page);
                  info->page = (NodeData *)0x0;
                }
                st__free_table(info->table);
                free(info);
                return pDVar16;
              }
              pDVar16 = *(DdNode **)((long)pvVar14 + 0x10);
              iVar11 = st__lookup(info->table,(char *)pDVar16,(char **)&local_88);
              if (iVar11 == 0) break;
              if (*(short *)((long)local_88 + 0x16) == 3) {
                iVar11 = 0x7fffffff;
                if ((ulong)pDVar16->index != 0x7fffffff) {
                  iVar11 = dd->perm[pDVar16->index];
                }
                cuddLevelQueueDequeue(queue,iVar11);
              }
              else {
                pDVar18 = (pDVar16->type).kids.T;
                g = (pDVar16->type).kids.E;
                pauVar1 = (undefined1 (*) [12])((long)pvVar14 + 0x18);
                dVar23 = *(double *)*pauVar1;
                dVar21 = *(double *)((long)pvVar14 + 0x20);
                auVar9 = *pauVar1;
                auVar8 = *pauVar1;
                local_b8 = SUB84(dVar23,0);
                uStack_b4 = (undefined4)((ulong)dVar23 >> 0x20);
                uStack_b0 = SUB84(dVar21,0);
                uStack_ac = (undefined4)((ulong)dVar21 >> 0x20);
                iVar11 = Cudd_bddLeq(dd,pDVar18,g);
                local_c8 = (DdNode *)dVar23;
                local_80 = g;
                local_78 = pDVar18;
                if (iVar11 == 0) {
                  iVar11 = Cudd_bddLeq(dd,g,pDVar18);
                  key = (DdNode *)((ulong)g & 0xfffffffffffffffe);
                  if (iVar11 != 0) {
                    st__lookup(info->table,(char *)pDVar18,(char **)&local_90);
                    st__lookup(info->table,(char *)key,(char **)&local_98);
                    if (*(short *)((long)local_88 + 0x16) == 1) {
                      dVar26 = *local_90 * 0.5 - local_98[g != key] * 0.5;
                      bVar19 = 1;
                      if (*(int *)(local_90 + 2) != 1) {
                        iVar11 = 1;
                        goto LAB_00774b89;
                      }
                      pDVar18 = local_78;
                      if (*(int *)((ulong)local_78 & 0xfffffffffffffffe) != 0x7fffffff)
                      goto LAB_00774aa4;
LAB_00774b83:
                      iVar11 = 1;
                      goto LAB_00774b89;
                    }
                    dVar26 = local_98[g == key] * 0.5 - local_90[1] * 0.5;
                    bVar19 = 2;
                    local_c8 = (DdNode *)dVar21;
                    if ((*(int *)(local_98 + 2) != 1) || (key->index == 0x7fffffff))
                    goto LAB_00774b83;
                    iVar11 = computeSavings(dd,local_80,(DdNode *)0x0,info,queue_00);
                    if (iVar11 != 0) goto LAB_00774adb;
                    break;
                  }
                  auVar6._12_4_ = uStack_ac;
                  auVar6._0_12_ = auVar8;
                  if (pDVar18->index == key->index) {
                    uVar15 = (ulong)((uint)g & 1);
                    local_c8 = (pDVar18->type).kids.T;
                    if (local_c8 == (DdNode *)((ulong)(key->type).kids.T ^ uVar15)) {
                      bVar19 = 4;
                    }
                    else {
                      local_c8 = (pDVar18->type).kids.E;
                      if (local_c8 != (DdNode *)(uVar15 ^ (ulong)(key->type).kids.E))
                      goto LAB_00774b1e;
                      bVar19 = 5;
                    }
                  }
                  else {
LAB_00774b1e:
                    bVar19 = 3;
                    local_c8 = (DdNode *)0x0;
                  }
                  local_68._8_4_ = auVar8._8_4_;
                  local_68._0_8_ = auVar6._8_8_;
                  local_68._12_4_ = uStack_ac;
                  dVar26 = *local_88 * auVar8._0_8_ + local_88[1] * auVar6._8_8_;
                  iVar11 = computeSavings(dd,pDVar16,local_c8,info,queue_00);
                  if (local_c8 == (DdNode *)0x0) {
                    local_c8 = (DdNode *)0x0;
                  }
                  else {
                    st__lookup(info->table,(char *)((ulong)local_c8 & 0xfffffffffffffffe),&local_50)
                    ;
                    uVar15 = (ulong)((int)local_c8 * 8 & 8);
                    dVar26 = dVar26 + (*(double *)(local_50 + uVar15) * dVar23 +
                                      (double)local_68._0_8_ * *(double *)(local_50 + (uVar15 ^ 8)))
                                      * -0.5;
                    iVar11 = iVar11 + -1;
                  }
                }
                else {
                  st__lookup(info->table,(char *)pDVar18,(char **)&local_90);
                  st__lookup(info->table,(char *)g,(char **)&local_98);
                  if (*(short *)((long)local_88 + 0x16) == 1) {
                    dVar26 = *local_98 * 0.5 - *local_90 * 0.5;
                    bVar19 = 2;
                    iVar11 = 1;
                    if ((*(int *)(local_98 + 2) == 1) &&
                       (pDVar18 = local_80,
                       *(int *)((ulong)local_80 & 0xfffffffffffffffe) != 0x7fffffff))
                    goto LAB_00774aa4;
                  }
                  else {
                    dVar26 = local_90[1] * 0.5 - local_98[1] * 0.5;
                    bVar19 = 1;
                    local_c8 = (DdNode *)dVar21;
                    if ((*(int *)(local_90 + 2) != 1) ||
                       (pDVar18 = local_78,
                       *(int *)((ulong)local_78 & 0xfffffffffffffffe) == 0x7fffffff))
                    goto LAB_00774b83;
LAB_00774aa4:
                    iVar11 = computeSavings(dd,pDVar18,(DdNode *)0x0,info,queue_00);
                    if (iVar11 == 0) break;
LAB_00774adb:
                    iVar11 = iVar11 + 1;
                  }
LAB_00774b89:
                  dVar26 = dVar26 * (double)local_c8;
                  local_c8 = (DdNode *)0x0;
                }
                iVar12 = 0x7fffffff;
                if ((ulong)pDVar16->index != 0x7fffffff) {
                  iVar12 = dd->perm[pDVar16->index];
                }
                cuddLevelQueueDequeue(queue,iVar12);
                dVar2 = info->minterms;
                iVar12 = info->size;
                dVar27 = (double)iVar12;
                auVar28._8_8_ = (double)iVar11;
                auVar28._0_8_ = dVar26;
                auVar3._8_4_ = SUB84(dVar27,0);
                auVar3._0_8_ = dVar2;
                auVar3._12_4_ = (int)((ulong)dVar27 >> 0x20);
                auVar29 = divpd(auVar28,auVar3);
                dVar27 = 1.0 - auVar29._0_8_;
                dVar5 = 1.0 - auVar29._8_8_;
                local_48._0_8_ = dVar5 * local_58;
                local_48._8_8_ = dVar5;
                local_68._8_4_ = SUB84(dVar5,0);
                local_68._0_8_ = dVar27;
                local_68._12_4_ = (int)((ulong)dVar5 >> 0x20);
                bVar10 = 0;
                if (dVar27 <= (double)local_48._0_8_) {
LAB_00774cdf:
                  bVar19 = bVar10;
                  pDVar18 = (pDVar16->type).kids.T;
                  uVar15 = (ulong)pDVar18->index;
                  if (uVar15 != 0x7fffffff) {
                    pvVar14 = cuddLevelQueueEnqueue(queue,pDVar18,dd->perm[uVar15]);
                    if ((double)local_68._0_8_ <= (double)local_48._0_8_) {
                      auVar7._12_4_ = uStack_ac;
                      auVar7._0_12_ = auVar9;
                      *(double *)((long)pvVar14 + 0x18) =
                           dVar23 * 0.5 + *(double *)((long)pvVar14 + 0x18);
                      dVar26 = auVar7._8_8_ * 0.5;
                    }
                    else {
                      *(double *)((long)pvVar14 + 0x18) = *(double *)((long)pvVar14 + 0x18) + dVar23
                      ;
                      dVar26 = dVar21;
                    }
                    *(double *)((long)pvVar14 + 0x20) = dVar26 + *(double *)((long)pvVar14 + 0x20);
                  }
LAB_00774d6d:
                  uVar24 = local_b8;
                  uVar25 = uStack_b4;
                  if (bVar19 < 2) {
                    puVar20 = (uint *)((ulong)(pDVar16->type).kids.E & 0xfffffffffffffffe);
                    uVar15 = (ulong)*puVar20;
                    if (uVar15 == 0x7fffffff) goto LAB_00774d85;
                    pvVar14 = cuddLevelQueueEnqueue(queue,puVar20,dd->perm[uVar15]);
                    if ((undefined1  [16])((undefined1  [16])pDVar16->type & (undefined1  [16])0x1)
                        != (undefined1  [16])0x0) {
                      if (bVar19 != 1) {
                        dVar21 = dVar21 * 0.5;
                        dVar23 = dVar23 * 0.5;
                      }
LAB_00774e6c:
                      *(double *)((long)pvVar14 + 0x18) = *(double *)((long)pvVar14 + 0x18) + dVar21
                      ;
                      *(double *)((long)pvVar14 + 0x20) = *(double *)((long)pvVar14 + 0x20) + dVar23
                      ;
                      goto LAB_00774e7a;
                    }
                    if (bVar19 != 1) {
                      dVar26 = dVar23 * 0.5;
                      dVar23 = dVar21 * 0.5;
                      dVar21 = dVar26;
                      goto LAB_00774e6c;
                    }
                    dVar21 = *(double *)((long)pvVar14 + 0x18);
                    dVar23 = *(double *)((long)pvVar14 + 0x20);
                    local_b8 = uStack_b0;
                    uStack_b4 = uStack_ac;
LAB_00774e25:
                    dVar23 = (double)CONCAT44(uStack_b4,local_b8) + dVar23;
                    auVar4._8_4_ = SUB84(dVar23,0);
                    auVar4._0_8_ = (double)CONCAT44(uVar25,uVar24) + dVar21;
                    auVar4._12_4_ = (int)((ulong)dVar23 >> 0x20);
                    *(undefined1 (*) [16])((long)pvVar14 + 0x18) = auVar4;
                  }
                  else {
LAB_00774d85:
                    if ((bVar19 & 0xfe) == 4) {
                      uVar15 = (ulong)*(uint *)((ulong)local_c8 & 0xfffffffffffffffe);
                      if (uVar15 != 0x7fffffff) {
                        pvVar14 = cuddLevelQueueEnqueue
                                            (queue,(uint *)((ulong)local_c8 & 0xfffffffffffffffe),
                                             dd->perm[uVar15]);
                        dVar21 = *(double *)((long)pvVar14 + 0x18);
                        if (((ulong)local_c8 & 1) == 0) {
                          dVar23 = *(double *)((long)pvVar14 + 0x20);
                          local_b8 = uStack_b0;
                          uStack_b4 = uStack_ac;
                        }
                        else {
                          dVar23 = *(double *)((long)pvVar14 + 0x20);
                          uVar24 = uStack_b0;
                          uVar25 = uStack_ac;
                        }
                        goto LAB_00774e25;
                      }
                    }
                  }
                }
                else {
                  *(byte *)((long)local_88 + 0x15) = bVar19;
                  info->size = iVar12 - iVar11;
                  info->minterms = dVar2 - dVar26;
                  if (bVar19 == 3) {
                    iVar12 = updateRefs(dd,pDVar16,(DdNode *)0x0,info,queue_00);
                    if (iVar11 != iVar12) goto LAB_00775128;
                  }
                  else {
                    pDVar18 = local_78;
                    if ((bVar19 == 2) || (pDVar18 = local_80, bVar19 == 1)) {
                      iVar12 = updateRefs(dd,pDVar16,pDVar18,info,queue_00);
                    }
                    else {
                      iVar12 = updateRefs(dd,pDVar16,local_c8,info,queue_00);
                      iVar12 = iVar12 + -1;
                    }
                    if (iVar11 != iVar12) {
LAB_00775128:
                      __assert_fail("savings == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddApprox.c"
                                    ,0x640,
                                    "int RAmarkNodes(DdManager *, DdNode *, ApproxInfo *, int, double)"
                                   );
                    }
                    if (bVar19 != 3) {
                      bVar10 = bVar19;
                      if (bVar19 == 2) goto LAB_00774cdf;
                      goto LAB_00774d6d;
                    }
                  }
                }
              }
LAB_00774e7a:
              pvVar14 = queue->first;
              iVar12 = local_6c;
              iVar11 = local_6c;
            } while( true );
          }
          cuddLevelQueueQuit(queue);
          queue = queue_00;
        }
        cuddLevelQueueQuit(queue);
      }
      fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
      if (info->page != (NodeData *)0x0) {
        free(info->page);
        info->page = (NodeData *)0x0;
      }
      st__free_table(info->table);
      free(info);
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddRemapUnderApprox(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold under which approximation stops */,
  double  quality /* minimum improvement for accepted changes */)
{
    ApproxInfo *info;
    DdNode *subset;
    int result;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    /* Create table where node data are accessible via a hash table. */
    info = gatherInfo(dd, f, numVars, TRUE);
    if (info == NULL) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Mark nodes that should be replaced by zero. */
    result = RAmarkNodes(dd, f, info, threshold, quality);
    if (result == 0) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        ABC_FREE(info->page);
        st__free_table(info->table);
        ABC_FREE(info);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    /* Build the result. */
    subset = RAbuildSubset(dd, f, info);
#if 1
    if (subset && info->size < Cudd_DagSize(subset))
        (void) fprintf(dd->err, "Wrong prediction: %d versus actual %d\n",
                       info->size, Cudd_DagSize(subset));
#endif
    ABC_FREE(info->page);
    st__free_table(info->table);
    ABC_FREE(info);

#ifdef DD_DEBUG
    if (subset != NULL) {
        cuddRef(subset);
#if 0
        (void) Cudd_DebugCheck(dd);
        (void) Cudd_CheckKeys(dd);
#endif
        if (!Cudd_bddLeq(dd, subset, f)) {
            (void) fprintf(dd->err, "Wrong subset\n");
        }
        cuddDeref(subset);
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }
#endif
    return(subset);

}